

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
vkt::ssbo::anon_unknown_0::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,TestContext *testCtx,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances,MatrixLoadFlags matrixLoadFlag)

{
  BufferBlock *this_00;
  BufferVar BStack_68;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,"",BUFFERMODE_PER_BLOCK,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00c03a20;
  this_00 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  BufferVar::BufferVar(&BStack_68,"var",(VarType *)description,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (&this_00->m_variables,&BStack_68);
  BufferVar::~BufferVar(&BStack_68);
  this_00->m_flags = (deUint32)type;
  if (0 < (int)layoutFlags) {
    BufferBlock::setArraySize(this_00,layoutFlags);
    std::__cxx11::string::assign((char *)&this_00->m_instanceName);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockBasicTypeCase (tcu::TestContext& testCtx, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase(testCtx, name, description, BUFFERMODE_PER_BLOCK, matrixLoadFlag)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", type, ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}

		init();
	}